

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_array_primitive_hash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_object_tuple_t *object;
  sysbvm_tuple_t sVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  uint64_t value;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar3 = *arguments;
  if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
    uVar4 = (ulong)(*(uint *)(uVar3 + 0xc) >> 3);
  }
  else {
    uVar4 = 0;
  }
  sVar1 = sysbvm_tuple_getType(context,uVar3);
  if ((sVar1 & 0xf) == 0 && sVar1 != 0) {
    value = (uint64_t)(*(uint *)(sVar1 + 8) >> 10);
  }
  else {
    value = sVar1 * 0x41c64e6d & 0x7ffffffffffffff;
  }
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    sVar2 = sysbvm_tuple_hash(context,*(sysbvm_tuple_t *)(*arguments + 0x10 + uVar3 * 8));
    value = value * 0x41c64e6d + sVar2 & 0x7ffffffffffffff;
  }
  sVar1 = sysbvm_tuple_uint64_encode(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_array_primitive_hash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_array_t **array = (sysbvm_array_t **)&arguments[0];
    size_t size = sysbvm_array_getSize((sysbvm_tuple_t)*array);

    size_t result = sysbvm_tuple_identityHash(sysbvm_tuple_getType(context, (sysbvm_tuple_t)*array));
    for(size_t i = 0; i < size; ++i)
        result = sysbvm_hashConcatenate(result, sysbvm_tuple_hash(context, (*array)->elements[i]));

    return sysbvm_tuple_size_encode(context, result);
}